

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O1

void dma_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations)

{
  byte bVar1;
  uint32_t uVar2;
  pointer pDVar3;
  Annotation *pAVar4;
  ulong uVar5;
  DmaTransfer *d;
  pointer pDVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t local_107c;
  Annotation *local_1078;
  Annotation *from;
  Profile profile;
  StringBuilder sb;
  
  profile._msg = "DMA report";
  profile._start = clock();
  profile._hide_if_fast = true;
  ReportWriter::writeSeperator(writer,"DMA analysis");
  ReportWriter::writeComment(writer,"");
  ReportWriter::writeComment(writer,"Currently not sure if we can deduce step or not!");
  ReportWriter::writeComment
            (writer,
             "Currently not doing anything with data annotations! Let me know what I could do!");
  ReportWriter::writeComment(writer,"HDMA is not supported. Can be added in.");
  ReportWriter::writeComment(writer,"");
  memset(&sb,0,0x1004);
  pDVar6 = (trace->dma_transfers).
           super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (trace->dma_transfers).
           super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar6 != pDVar3) {
    local_1078 = (Annotation *)0x0;
    uVar10 = 0xffffffff;
    do {
      uVar2 = pDVar6->pc;
      local_107c = uVar10;
      if (uVar10 != uVar2) {
        snestistics::AnnotationResolver::resolve_annotation
                  (annotations,pDVar6->pc,&from,(Annotation **)0x0);
        pAVar4 = from;
        if (local_1078 != from) {
          if (from == (Annotation *)0x0) {
            snestistics::StringBuilder::format(&sb,"(unannotated)");
            local_1078 = (Annotation *)0x0;
          }
          else {
            snestistics::StringBuilder::format(&sb,"%s",(from->name)._M_dataplus._M_p);
            local_1078 = pAVar4;
          }
        }
        local_107c = pDVar6->pc;
      }
      snestistics::StringBuilder::column(&sb,0x1e,4);
      snestistics::StringBuilder::format(&sb,"%d",(ulong)pDVar6->channel);
      if (pDVar6->b_address == 0x80) {
        uVar11 = pDVar6->wram;
      }
      else {
        uVar11 = pDVar6->b_address | 0x2100;
      }
      snestistics::StringBuilder::column(&sb,0x18,4);
      uVar5 = (ulong)pDVar6->transfer_bytes;
      if (pDVar6->transfer_bytes == 0) {
        uVar5 = 0x10000;
      }
      bVar1 = pDVar6->flags;
      pcVar8 = "<-";
      if ((bVar1 & 1) == 0) {
        pcVar8 = "->";
      }
      pcVar7 = " (dec)";
      if ((bVar1 & 4) == 0) {
        pcVar7 = " (inc)";
      }
      pcVar9 = " (fixed)";
      if ((bVar1 & 2) == 0) {
        pcVar9 = "";
      }
      snestistics::StringBuilder::format
                (&sb,"$%05X $%02X:$%04X %s $%02X:%04X (mode=$%02X)%s%s",uVar5,(ulong)pDVar6->a_bank,
                 (ulong)pDVar6->a_address,pcVar8,(ulong)(uVar11 >> 0x10),(ulong)(uVar11 & 0xffff),
                 (ulong)pDVar6->transfer_mode,pcVar7,pcVar9);
      if (uVar10 != uVar2) {
        snestistics::StringBuilder::column(&sb,0x56,4);
        snestistics::StringBuilder::format(&sb,"at pc=$%06X",(ulong)pDVar6->pc);
      }
      ReportWriter::writeComment(writer,&sb);
      pDVar6 = pDVar6 + 1;
      uVar10 = local_107c;
    } while (pDVar6 != pDVar3);
  }
  snestistics::Profile::~Profile(&profile);
  return;
}

Assistant:

void dma_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations) {
	Profile profile("DMA report", true);
	writer.writeSeperator("DMA analysis");
	writer.writeComment("");
	writer.writeComment("Currently not sure if we can deduce step or not!");
	writer.writeComment("Currently not doing anything with data annotations! Let me know what I could do!");
	writer.writeComment("HDMA is not supported. Can be added in.");
	writer.writeComment("");

	StringBuilder sb;

	const Annotation* reported_function = nullptr;
	Pointer reported_pc = -1;

	for (const DmaTransfer &d : trace.dma_transfers) {

		bool print_pc = false;

		if (reported_pc != d.pc) {
			const Annotation *from;
			annotations.resolve_annotation(d.pc, &from);

			if (reported_function != from) {
				reported_function = from;

				if (from) {
					sb.format("%s", from->name.c_str());
				} else {
					sb.format("(unannotated)");
				}
			}

			print_pc = true;
			reported_pc = d.pc;
		}

		sb.column(30); sb.format("%d", d.channel);

		Pointer target = 0x2100|d.b_address;
		if (d.b_address == 0x80) {
			target = d.wram;
		}
		sb.column(24); sb.format("$%05X $%02X:$%04X %s $%02X:%04X (mode=$%02X)%s%s", d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes, d.a_bank, d.a_address, d.flags & DmaTransfer::REVERSE_TRANSFER ? "<-":"->", target>>16, target&0xFFFF, d.transfer_mode, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (dec)":" (inc)", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (fixed)":"");

		if (print_pc) {
			sb.column(86);  sb.format("at pc=$%06X", d.pc);
		}
		writer.writeComment(sb);
	}
}